

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixWrite(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  sqlite3_io_methods *psVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  size_t __n;
  
  psVar1 = id[10].pMethods;
  if ((long)psVar1 - offset != 0 && offset <= (long)psVar1) {
    if (amt + offset <= (long)psVar1) {
      memcpy((void *)((long)&(id[0xd].pMethods)->iVersion + offset),pBuf,(long)amt);
      return 0;
    }
    iVar4 = (int)((long)psVar1 - offset);
    __n = (size_t)iVar4;
    memcpy((void *)((long)&(id[0xd].pMethods)->iVersion + offset),pBuf,__n);
    pBuf = (void *)((long)pBuf + __n);
    amt = amt - iVar4;
    offset = offset + __n;
  }
  bVar2 = 0 < amt;
  if (amt < 1) {
    bVar3 = 0;
  }
  else {
    while (uVar5 = seekAndWriteFd(*(int *)&id[3].pMethods,offset,pBuf,amt,(int *)(id + 4)),
          0 < (int)uVar5) {
      bVar2 = 0 < (int)(amt - uVar5);
      if (amt - uVar5 == 0 || amt < (int)uVar5) break;
      offset = offset + (ulong)uVar5;
      pBuf = (void *)((long)pBuf + (ulong)uVar5);
      amt = amt - uVar5;
    }
    bVar3 = (byte)(uVar5 >> 0x1f);
  }
  iVar4 = 0;
  if ((bVar2) && ((bVar3 == 0 || (iVar4 = 0x30a, *(int *)&id[4].pMethods == 0x1c)))) {
    *(undefined4 *)&id[4].pMethods = 0;
    iVar4 = 0xd;
  }
  return iVar4;
}

Assistant:

static int unixWrite(
  sqlite3_file *id, 
  const void *pBuf, 
  int amt,
  sqlite3_int64 offset 
){
  unixFile *pFile = (unixFile*)id;
  int wrote = 0;
  assert( id );
  assert( amt>0 );

  /* If this is a database file (not a journal, master-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE 
  );
#endif

#ifdef SQLITE_DEBUG
  /* If we are doing a normal write to a database file (as opposed to
  ** doing a hot-journal rollback or a write to some file other than a
  ** normal database file) then record the fact that the database
  ** has changed.  If the transaction counter is modified, record that
  ** fact too.
  */
  if( pFile->inNormalWrite ){
    pFile->dbUpdate = 1;  /* The database has been modified */
    if( offset<=24 && offset+amt>=27 ){
      int rc;
      char oldCntr[4];
      SimulateIOErrorBenign(1);
      rc = seekAndRead(pFile, 24, oldCntr, 4);
      SimulateIOErrorBenign(0);
      if( rc!=4 || memcmp(oldCntr, &((char*)pBuf)[24-offset], 4)!=0 ){
        pFile->transCntrChng = 1;  /* The transaction counter has changed */
      }
    }
  }
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this write request as possible by transfering
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(&((u8 *)(pFile->pMapRegion))[offset], pBuf, amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(&((u8 *)(pFile->pMapRegion))[offset], pBuf, nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  while( amt>0 && (wrote = seekAndWrite(pFile, offset, pBuf, amt))>0 ){
    amt -= wrote;
    offset += wrote;
    pBuf = &((char*)pBuf)[wrote];
  }
  SimulateIOError(( wrote=(-1), amt=1 ));
  SimulateDiskfullError(( wrote=0, amt=1 ));

  if( amt>0 ){
    if( wrote<0 && pFile->lastErrno!=ENOSPC ){
      /* lastErrno set by seekAndWrite */
      return SQLITE_IOERR_WRITE;
    }else{
      pFile->lastErrno = 0; /* not a system error */
      return SQLITE_FULL;
    }
  }

  return SQLITE_OK;
}